

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# section.cpp
# Opt level: O0

int process_paths(vector<gdsPATH,_std::allocator<gdsPATH>_> *current_paths,
                 map<unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>_>_>_>
                 *poly_map_destination)

{
  bool bVar1;
  reference pgVar2;
  pointer pgVar3;
  size_type sVar4;
  mapped_type *this;
  pair<unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>_> local_110;
  undefined1 local_f0 [8];
  vector<co_ord,_std::allocator<co_ord>_> new_vector;
  gdsPATH local_c8;
  __normal_iterator<gdsPATH_*,_std::vector<gdsPATH,_std::allocator<gdsPATH>_>_> local_58;
  undefined1 local_50 [8];
  co_ord temp_co;
  iterator path_iter;
  map<unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>_>_>_>
  *poly_map_destination_local;
  vector<gdsPATH,_std::allocator<gdsPATH>_> *current_paths_local;
  
  temp_co.y.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)std::vector<gdsPATH,_std::allocator<gdsPATH>_>::begin(current_paths);
  co_ord::co_ord((co_ord *)local_50);
  while( true ) {
    local_58._M_current =
         (gdsPATH *)std::vector<gdsPATH,_std::allocator<gdsPATH>_>::end(current_paths);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<gdsPATH_*,_std::vector<gdsPATH,_std::allocator<gdsPATH>_>_>
                        *)&temp_co.y.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,&local_58);
    if (!bVar1) break;
    pgVar2 = __gnu_cxx::
             __normal_iterator<gdsPATH_*,_std::vector<gdsPATH,_std::allocator<gdsPATH>_>_>::
             operator*((__normal_iterator<gdsPATH_*,_std::vector<gdsPATH,_std::allocator<gdsPATH>_>_>
                        *)&temp_co.y.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage);
    gdsPATH::gdsPATH(&local_c8,pgVar2);
    path_to_polygon(&local_c8,(co_ord *)local_50);
    gdsPATH::~gdsPATH(&local_c8);
    pgVar3 = __gnu_cxx::
             __normal_iterator<gdsPATH_*,_std::vector<gdsPATH,_std::allocator<gdsPATH>_>_>::
             operator->((__normal_iterator<gdsPATH_*,_std::vector<gdsPATH,_std::allocator<gdsPATH>_>_>
                         *)&temp_co.y.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage);
    sVar4 = std::
            map<unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>_>_>_>
            ::count(poly_map_destination,&pgVar3->layer);
    if (sVar4 == 0) {
      std::vector<co_ord,_std::allocator<co_ord>_>::vector
                ((vector<co_ord,_std::allocator<co_ord>_> *)local_f0);
      std::vector<co_ord,_std::allocator<co_ord>_>::push_back
                ((vector<co_ord,_std::allocator<co_ord>_> *)local_f0,(value_type *)local_50);
      pgVar3 = __gnu_cxx::
               __normal_iterator<gdsPATH_*,_std::vector<gdsPATH,_std::allocator<gdsPATH>_>_>::
               operator->((__normal_iterator<gdsPATH_*,_std::vector<gdsPATH,_std::allocator<gdsPATH>_>_>
                           *)&temp_co.y.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage);
      std::pair<unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>_>::
      pair<unsigned_int_&,_std::vector<co_ord,_std::allocator<co_ord>_>_&,_true>
                (&local_110,&pgVar3->layer,(vector<co_ord,_std::allocator<co_ord>_> *)local_f0);
      std::
      map<unsigned_int,std::vector<co_ord,std::allocator<co_ord>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::vector<co_ord,std::allocator<co_ord>>>>>
      ::insert<std::pair<unsigned_int,std::vector<co_ord,std::allocator<co_ord>>>>
                ((map<unsigned_int,std::vector<co_ord,std::allocator<co_ord>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::vector<co_ord,std::allocator<co_ord>>>>>
                  *)poly_map_destination,&local_110);
      std::pair<unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>_>::~pair(&local_110);
      std::vector<co_ord,_std::allocator<co_ord>_>::~vector
                ((vector<co_ord,_std::allocator<co_ord>_> *)local_f0);
    }
    else {
      pgVar3 = __gnu_cxx::
               __normal_iterator<gdsPATH_*,_std::vector<gdsPATH,_std::allocator<gdsPATH>_>_>::
               operator->((__normal_iterator<gdsPATH_*,_std::vector<gdsPATH,_std::allocator<gdsPATH>_>_>
                           *)&temp_co.y.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage);
      this = std::
             map<unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>_>_>_>
             ::operator[](poly_map_destination,&pgVar3->layer);
      std::vector<co_ord,_std::allocator<co_ord>_>::push_back(this,(value_type *)local_50);
    }
    __gnu_cxx::__normal_iterator<gdsPATH_*,_std::vector<gdsPATH,_std::allocator<gdsPATH>_>_>::
    operator++((__normal_iterator<gdsPATH_*,_std::vector<gdsPATH,_std::allocator<gdsPATH>_>_> *)
               &temp_co.y.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,0);
  }
  co_ord::~co_ord((co_ord *)local_50);
  return 0;
}

Assistant:

int process_paths(
    std::vector<gdsPATH> &current_paths,
    std::map<unsigned int, std::vector<co_ord>> &poly_map_destination)
{
  auto path_iter = current_paths.begin();
  co_ord temp_co;
  while (path_iter != current_paths.end()) {
    path_to_polygon(*path_iter, temp_co);
    if (poly_map_destination.count(path_iter->layer) > 0) // append
    {
      poly_map_destination[path_iter->layer].push_back(temp_co);
    } else {
      vector<co_ord> new_vector;
      new_vector.push_back(temp_co);
      poly_map_destination.insert(
          pair<unsigned int, vector<co_ord>>(path_iter->layer, new_vector));
    }
    path_iter++;
  }
  return EXIT_SUCCESS;
}